

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O1

void __thiscall Messages::AddressBook::~AddressBook(AddressBook *this)

{
  LogMessage *pLVar1;
  ulong uVar2;
  LogFinisher local_49;
  LogMessage local_48 [56];
  
  uVar2 = *(ulong *)&this->field_0x8;
  if ((uVar2 & 1) != 0) {
    uVar2 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
  }
  if (uVar2 != 0) {
    google::protobuf::internal::LogMessage::LogMessage
              (local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SamuelXing[P]protobuf-over-tcpsocket-example/build_O1/proto/messages.pb.cc"
               ,0x349);
    pLVar1 = (LogMessage *)
             google::protobuf::internal::LogMessage::operator<<
                       (local_48,"CHECK failed: GetArena() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_49,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(local_48);
  }
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            ((InternalMetadata *)&this->field_0x8);
  google::protobuf::RepeatedPtrField<Messages::Person>::~RepeatedPtrField(&this->people_);
  return;
}

Assistant:

AddressBook::~AddressBook() {
  // @@protoc_insertion_point(destructor:Messages.AddressBook)
  SharedDtor();
  _internal_metadata_.Delete<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>();
}